

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_strncat_l(archive_string *as,void *_p,size_t n,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string *paVar2;
  size_t sVar3;
  int *piVar4;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  wchar_t tn;
  wchar_t r2;
  wchar_t r;
  wchar_t i;
  size_t length;
  void *s;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc4;
  archive_string *in_stack_ffffffffffffffc8;
  void *local_30;
  wchar_t local_4;
  
  local_4 = L'\0';
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
    iVar5 = 1;
    if ((in_RCX != 0) && ((*(uint *)(in_RCX + 0x24) & 0x1400) != 0)) {
      iVar5 = 2;
    }
    paVar2 = archive_string_ensure
                       (in_stack_ffffffffffffffc8,(ulong)in_stack_ffffffffffffffc4 << 0x20);
    if (paVar2 == (archive_string *)0x0) {
      local_4 = L'\xffffffff';
    }
    else {
      *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
      if (iVar5 == 2) {
        *(undefined1 *)(*in_RDI + 1 + in_RDI[1]) = 0;
      }
      local_4 = L'\0';
    }
  }
  else if (in_RCX == 0) {
    paVar2 = (archive_string *)mbsnbytes(in_RSI,in_RDX);
    paVar2 = archive_string_append
                       (paVar2,(char *)CONCAT44(in_stack_ffffffffffffffc4,local_4),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (paVar2 == (archive_string *)0x0) {
      local_4 = L'\xffffffff';
    }
    else {
      local_4 = L'\0';
    }
  }
  else {
    if ((*(uint *)(in_RCX + 0x24) & 0x2800) == 0) {
      sVar3 = mbsnbytes(in_RSI,in_RDX);
    }
    else {
      sVar3 = utf16nbytes(in_RSI,in_RDX);
    }
    iVar5 = 0;
    local_30 = in_RSI;
    if (1 < *(int *)(in_RCX + 0x60)) {
      *(undefined8 *)(in_RCX + 0x40) = 0;
      wVar1 = (**(code **)(in_RCX + 0x50))(in_RCX + 0x38,in_RSI,sVar3,in_RCX);
      if ((wVar1 != L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
        return wVar1;
      }
      if (wVar1 < local_4) {
        local_4 = wVar1;
      }
      local_30 = *(void **)(in_RCX + 0x38);
      sVar3 = *(size_t *)(in_RCX + 0x40);
      iVar5 = iVar5 + 1;
    }
    wVar1 = (**(code **)(in_RCX + 0x50 + (long)iVar5 * 8))(in_RDI,local_30,sVar3,in_RCX);
    if (wVar1 < local_4) {
      local_4 = wVar1;
    }
  }
  return local_4;
}

Assistant:

int
archive_strncat_l(struct archive_string *as, const void *_p, size_t n,
    struct archive_string_conv *sc)
{
	const void *s;
	size_t length;
	int i, r = 0, r2;

	/* We must allocate memory even if there is no data for conversion
	 * or copy. This simulates archive_string_append behavior. */
	if (_p == NULL || n == 0) {
		int tn = 1;
		if (sc != NULL && (sc->flag & SCONV_TO_UTF16))
			tn = 2;
		if (archive_string_ensure(as, as->length + tn) == NULL)
			return (-1);
		as->s[as->length] = 0;
		if (tn == 2)
			as->s[as->length+1] = 0;
		return (0);
	}

	/*
	 * If sc is NULL, we just make a copy.
	 */
	if (sc == NULL) {
		length = mbsnbytes(_p, n);
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (0);
	}

	if (sc->flag & SCONV_FROM_UTF16)
		length = utf16nbytes(_p, n);
	else
		length = mbsnbytes(_p, n);
	s = _p;
	i = 0;
	if (sc->nconverter > 1) {
		sc->utftmp.length = 0;
		r2 = sc->converter[0](&(sc->utftmp), s, length, sc);
		if (r2 != 0 && errno == ENOMEM)
			return (r2);
		if (r > r2)
			r = r2;
		s = sc->utftmp.s;
		length = sc->utftmp.length;
		++i;
	}
	r2 = sc->converter[i](as, s, length, sc);
	if (r > r2)
		r = r2;
	return (r);
}